

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandMap(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  float fVar9;
  double dVar10;
  char Buffer [100];
  uint local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  uint local_d8;
  uint local_d4;
  uint local_cc;
  uint local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  undefined8 local_98;
  undefined1 local_90;
  
  pAVar4 = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  local_c8 = 1;
  local_d8 = 4;
  local_dc = 250.0;
  local_b0 = 0.0;
  local_c0 = -1.0;
  local_b8 = 0.0;
  local_e0 = 0.0;
  local_e4 = 0.0;
  bVar2 = false;
  local_cc = 0;
  local_d4 = 0;
  local_e8 = 0;
LAB_0020ad2a:
  while (iVar3 = Extra_UtilGetopt(argc,argv,"DABFSGMarspfvh"), iVar8 = globalUtilOptind,
        0x60 < iVar3) {
    switch(iVar3) {
    case 0x70:
      local_cc = local_cc ^ 1;
      break;
    case 0x71:
    case 0x74:
    case 0x75:
      goto switchD_0020ad52_caseD_71;
    case 0x72:
      local_c8 = local_c8 ^ 1;
      break;
    case 0x73:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 0x76:
      local_e8 = local_e8 ^ 1;
      break;
    default:
      if (iVar3 == 0x61) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else {
        if (iVar3 != 0x66) goto switchD_0020ad52_caseD_71;
        local_d4 = local_d4 ^ 1;
      }
    }
  }
  switch(iVar3) {
  case 0x41:
    if (globalUtilOptind < argc) {
      dVar10 = atof(argv[globalUtilOptind]);
      local_b0 = (double)(float)dVar10;
LAB_0020aec0:
      globalUtilOptind = iVar8 + 1;
      goto LAB_0020ad2a;
    }
    pcVar6 = "Command line switch \"-A\" should be followed by a floating point number.\n";
    break;
  case 0x42:
    if (globalUtilOptind < argc) {
      dVar10 = atof(argv[globalUtilOptind]);
      local_b8 = (double)(float)dVar10;
      goto LAB_0020aec0;
    }
    pcVar6 = "Command line switch \"-B\" should be followed by a floating point number.\n";
    break;
  case 0x43:
  case 0x45:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
    goto switchD_0020ad52_caseD_71;
  case 0x44:
    if (globalUtilOptind < argc) {
      dVar10 = atof(argv[globalUtilOptind]);
      fVar9 = (float)dVar10;
      local_c0 = (double)fVar9;
LAB_0020aefc:
      globalUtilOptind = iVar8 + 1;
      if (fVar9 <= 0.0) goto switchD_0020ad52_caseD_71;
      goto LAB_0020ad2a;
    }
    pcVar6 = "Command line switch \"-D\" should be followed by a floating point number.\n";
    break;
  case 0x46:
    if (globalUtilOptind < argc) {
      dVar10 = atof(argv[globalUtilOptind]);
      local_e0 = (float)dVar10;
      globalUtilOptind = iVar8 + 1;
      if (local_e0 < 0.0) goto switchD_0020ad52_caseD_71;
      goto LAB_0020ad2a;
    }
    pcVar6 = "Command line switch \"-F\" should be followed by a floating point number.\n";
    break;
  case 0x47:
    if (globalUtilOptind < argc) {
      dVar10 = atof(argv[globalUtilOptind]);
      fVar9 = (float)dVar10;
      local_dc = fVar9;
      goto LAB_0020aefc;
    }
    pcVar6 = "Command line switch \"-G\" should be followed by a floating point number.\n";
    break;
  case 0x4d:
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-M\" should be followed by a positive integer.\n";
      break;
    }
    local_d8 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar8 + 1;
    if ((int)local_d8 < 0) {
switchD_0020ad52_caseD_71:
      if ((local_c0 != -1.0) || (NAN(local_c0))) {
        sprintf((char *)&local_98,"%.3f");
      }
      else {
        local_98 = 0x6465737520746f6e;
        local_90 = 0;
      }
      Abc_Print(-2,"usage: map [-DABFSG float] [-M num] [-arspfvh]\n");
      Abc_Print(-2,"\t           performs standard cell mapping of the current network\n");
      Abc_Print(-2,"\t-D float : sets the global required times [default = %s]\n",&local_98);
      Abc_Print(-2,"\t-A float : \"area multiplier\" to bias gate selection [default = %.2f]\n",
                local_b0);
      Abc_Print(-2,"\t-B float : \"delay multiplier\" to bias gate selection [default = %.2f]\n",
                local_b8);
      Abc_Print(-2,"\t-F float : the logarithmic fanout delay parameter [default = %.2f]\n",
                (double)local_e0);
      Abc_Print(-2,"\t-S float : the slew parameter used to generate the library [default = %.2f]\n"
                ,(double)local_e4);
      Abc_Print(-2,"\t-G float : the gain parameter used to generate the library [default = %.2f]\n"
                ,(double)local_dc);
      Abc_Print(-2,"\t-M num   : skip gate classes whose size is less than this [default = %d]\n",
                (ulong)local_d8);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-a       : toggles area-only mapping [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_c8 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-r       : toggles area recovery [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (!bVar2) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-s       : toggles sweep after mapping [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_cc == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-p       : optimizes power by minimizing switching [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_d4 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-f       : do not use large gates to map high-fanout nodes [default = %s]\n",
                pcVar6);
      if (local_e8 == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar7);
      pcVar6 = "\t-h       : print the command usage\n";
      iVar8 = -2;
LAB_0020b1bf:
      Abc_Print(iVar8,pcVar6);
      return 1;
    }
    goto LAB_0020ad2a;
  default:
    if (iVar3 != 0x53) {
      if (iVar3 == -1) {
        if (pAVar4 == (Abc_Ntk_t *)0x0) {
          pcVar6 = "Empty network.\n";
        }
        else {
          if (bVar1) {
            local_c0 = 1000000000.0;
          }
          if (pAVar4->ntkType == ABC_NTK_STRASH) {
            pAVar4 = Abc_NtkMap(pAVar4,local_c0,local_b0,local_b8,local_e0,local_e4,local_dc,
                                local_d8,local_c8,local_cc,local_d4,local_e8);
          }
          else {
            pAVar4 = Abc_NtkStrash(pAVar4,0,0,0);
            if (pAVar4 == (Abc_Ntk_t *)0x0) {
              pcVar6 = "Strashing before mapping has failed.\n";
              goto LAB_0020b2eb;
            }
            pAVar5 = Abc_NtkBalance(pAVar4,0,0,1);
            Abc_NtkDelete(pAVar4);
            if (pAVar5 == (Abc_Ntk_t *)0x0) {
              Abc_Print(-1,"Balancing before mapping has failed.\n");
              return 1;
            }
            Abc_Print(0,"The network was strashed and balanced before mapping.\n");
            pAVar4 = Abc_NtkMap(pAVar5,local_c0,local_b0,local_b8,local_e0,local_e4,local_dc,
                                local_d8,local_c8,local_cc,local_d4,local_e8);
            Abc_NtkDelete(pAVar5);
          }
          if (pAVar4 != (Abc_Ntk_t *)0x0) {
            pAVar5 = pAVar4;
            if ((bVar2) && (Abc_NtkFraigSweep(pAVar4,0,0,0,0), pAVar4->ntkFunc == ABC_FUNC_MAP)) {
              pAVar5 = Abc_NtkDupDfs(pAVar4);
              Abc_NtkDelete(pAVar4);
            }
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar5);
            return 0;
          }
          pcVar6 = "Mapping has failed.\n";
        }
LAB_0020b2eb:
        iVar8 = -1;
        goto LAB_0020b1bf;
      }
      goto switchD_0020ad52_caseD_71;
    }
    if (globalUtilOptind < argc) {
      dVar10 = atof(argv[globalUtilOptind]);
      fVar9 = (float)dVar10;
      local_e4 = fVar9;
      goto LAB_0020aefc;
    }
    pcVar6 = "Command line switch \"-S\" should be followed by a floating point number.\n";
  }
  Abc_Print(-1,pcVar6);
  goto switchD_0020ad52_caseD_71;
}

Assistant:

int Abc_CommandMap( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    char Buffer[100];
    double DelayTarget;
    double AreaMulti;
    double DelayMulti;
    float LogFan = 0;
    float Slew = 0; // choose based on the library
    float Gain = 250;
    int nGatesMin = 4;
    int fAreaOnly;
    int fRecovery;
    int fSweep;
    int fSwitching;
    int fSkipFanout;
    int fVerbose;
    int c;
    extern Abc_Ntk_t * Abc_NtkMap( Abc_Ntk_t * pNtk, double DelayTarget, double AreaMulti, double DelayMulti, float LogFan, float Slew, float Gain, int nGatesMin, int fRecovery, int fSwitching, int fSkipFanout, int fVerbose );
    extern int Abc_NtkFraigSweep( Abc_Ntk_t * pNtk, int fUseInv, int fExdc, int fVerbose, int fVeryVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    DelayTarget =-1;
    AreaMulti   = 0;
    DelayMulti  = 0;
    fAreaOnly   = 0;
    fRecovery   = 1;
    fSweep      = 0;
    fSwitching  = 0;
    fSkipFanout = 0;
    fVerbose    = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "DABFSGMarspfvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                goto usage;
            }
            DelayTarget = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( DelayTarget <= 0.0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a floating point number.\n" );
                goto usage;
            }
            AreaMulti = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by a floating point number.\n" );
                goto usage;
            }
            DelayMulti = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a floating point number.\n" );
                goto usage;
            }
            LogFan = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( LogFan < 0.0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Slew = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Slew <= 0.0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Gain = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Gain <= 0.0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nGatesMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nGatesMin < 0 ) 
                goto usage;
            break;
        case 'a':
            fAreaOnly ^= 1;
            break;
        case 'r':
            fRecovery ^= 1;
            break;
        case 's':
            fSweep ^= 1;
            break;
        case 'p':
            fSwitching ^= 1;
            break;
        case 'f':
            fSkipFanout ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fAreaOnly )
        DelayTarget = ABC_INFINITY;

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        pNtk = Abc_NtkStrash( pNtk, 0, 0, 0 );
        if ( pNtk == NULL )
        {
            Abc_Print( -1, "Strashing before mapping has failed.\n" );
            return 1;
        }
        pNtk = Abc_NtkBalance( pNtkRes = pNtk, 0, 0, 1 );
        Abc_NtkDelete( pNtkRes );
        if ( pNtk == NULL )
        {
            Abc_Print( -1, "Balancing before mapping has failed.\n" );
            return 1;
        }
        Abc_Print( 0, "The network was strashed and balanced before mapping.\n" );
        // get the new network
        pNtkRes = Abc_NtkMap( pNtk, DelayTarget, AreaMulti, DelayMulti, LogFan, Slew, Gain, nGatesMin, fRecovery, fSwitching, fSkipFanout, fVerbose );
        if ( pNtkRes == NULL )
        {
            Abc_NtkDelete( pNtk );
            Abc_Print( -1, "Mapping has failed.\n" );
            return 1;
        }
        Abc_NtkDelete( pNtk );
    }
    else
    {
        // get the new network
        pNtkRes = Abc_NtkMap( pNtk, DelayTarget, AreaMulti, DelayMulti, LogFan, Slew, Gain, nGatesMin, fRecovery, fSwitching, fSkipFanout, fVerbose );
        if ( pNtkRes == NULL )
        {
            Abc_Print( -1, "Mapping has failed.\n" );
            return 1;
        }
    }

    if ( fSweep )
    {
        Abc_NtkFraigSweep( pNtkRes, 0, 0, 0, 0 );
        if ( Abc_NtkHasMapping(pNtkRes) )
        {
            pNtkRes = Abc_NtkDupDfs( pNtk = pNtkRes );
            Abc_NtkDelete( pNtk );
        }
    }

    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    if ( DelayTarget == -1 )
        sprintf(Buffer, "not used" );
    else
        sprintf(Buffer, "%.3f", DelayTarget );
    Abc_Print( -2, "usage: map [-DABFSG float] [-M num] [-arspfvh]\n" );
    Abc_Print( -2, "\t           performs standard cell mapping of the current network\n" );
    Abc_Print( -2, "\t-D float : sets the global required times [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-A float : \"area multiplier\" to bias gate selection [default = %.2f]\n", AreaMulti );
    Abc_Print( -2, "\t-B float : \"delay multiplier\" to bias gate selection [default = %.2f]\n", DelayMulti );
    Abc_Print( -2, "\t-F float : the logarithmic fanout delay parameter [default = %.2f]\n", LogFan );
    Abc_Print( -2, "\t-S float : the slew parameter used to generate the library [default = %.2f]\n", Slew );
    Abc_Print( -2, "\t-G float : the gain parameter used to generate the library [default = %.2f]\n", Gain );
    Abc_Print( -2, "\t-M num   : skip gate classes whose size is less than this [default = %d]\n", nGatesMin );
    Abc_Print( -2, "\t-a       : toggles area-only mapping [default = %s]\n", fAreaOnly? "yes": "no" );
    Abc_Print( -2, "\t-r       : toggles area recovery [default = %s]\n", fRecovery? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggles sweep after mapping [default = %s]\n", fSweep? "yes": "no" );
    Abc_Print( -2, "\t-p       : optimizes power by minimizing switching [default = %s]\n", fSwitching? "yes": "no" );
    Abc_Print( -2, "\t-f       : do not use large gates to map high-fanout nodes [default = %s]\n", fSkipFanout? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}